

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallTargetGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  Entry *config_00;
  cmCompiledGeneratorExpression *this_00;
  cmLocalGenerator *lg;
  char *pcVar1;
  allocator local_99;
  string local_98;
  undefined1 local_78 [56];
  undefined1 local_40 [8];
  cmGeneratorExpression ge;
  string *config_local;
  cmInstallTargetGenerator *this_local;
  
  ge.Backtrace.Cur = (Entry *)config;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)(local_78 + 0x18));
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_40,(cmListFileBacktrace *)(local_78 + 0x18));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_78 + 0x18));
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_78,(string *)local_40);
  this_00 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                      ((auto_ptr<cmCompiledGeneratorExpression> *)local_78);
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  config_00 = ge.Backtrace.Cur;
  std::__cxx11::string::string((string *)&local_98);
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,lg,(string *)config_00,false,(cmGeneratorTarget *)0x0,
                      (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_98);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_78);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetDestination(
  std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)
    ->Evaluate(this->Target->GetLocalGenerator(), config);
}